

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.cpp
# Opt level: O2

Interaction * __thiscall
phyr::Sphere::sample
          (Interaction *__return_storage_ptr__,Sphere *this,Interaction *ref,Point2f *u,double *pdf)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  Vector3f wcX;
  Vector3f wc;
  Point3f pOrigin;
  Point3f pCenter;
  Vector3f local_c8;
  Vector3f local_a8;
  Vector3f local_88;
  Vector3f nWorld;
  Vector3f wcY;
  
  pOrigin.x = 0.0;
  pOrigin.y = 0.0;
  pOrigin.z = 0.0;
  Transform::operator()((this->super_Shape).localToWorld,&pOrigin);
  wc.z = pCenter.z - (ref->p).z;
  wc.x = pCenter.x - (ref->p).x;
  wc.y = pCenter.y - (ref->p).y;
  offsetRayOrigin(&pOrigin,&ref->p,&ref->n,&wc,&ref->pfError);
  if ((pOrigin.z - pCenter.z) * (pOrigin.z - pCenter.z) +
      (pOrigin.x - pCenter.x) * (pOrigin.x - pCenter.x) +
      (pOrigin.y - pCenter.y) * (pOrigin.y - pCenter.y) <= this->radius * this->radius) {
    (*(this->super_Shape)._vptr_Shape[7])(__return_storage_ptr__,this,u,pdf);
    wc.z = (__return_storage_ptr__->p).z - (ref->p).z;
    wc.x = (__return_storage_ptr__->p).x - (ref->p).x;
    wc.y = (__return_storage_ptr__->p).y - (ref->p).y;
    dVar7 = wc.z * wc.z + wc.x * wc.x + wc.y * wc.y;
    dVar4 = 0.0;
    if ((dVar7 != 0.0) || (NAN(dVar7))) {
      normalize<double>(&wcX,&wc);
      wc.z = wcX.z;
      wc.x = wcX.x;
      wc.y = wcX.y;
      dVar7 = distanceSquared<double>(&ref->p,&__return_storage_ptr__->p);
      wcX.z = -wc.z;
      wcX.y = -wc.y;
      wcX.x = -wc.x;
      dVar4 = absDot<double>(&__return_storage_ptr__->n,&wcX);
      dVar4 = (dVar7 / dVar4) * *pdf;
    }
    dVar7 = 0.0;
    if (ABS(dVar4) != INFINITY) {
      dVar7 = dVar4;
    }
    *pdf = dVar7;
  }
  else {
    wcX.z = pCenter.z - (ref->p).z;
    dVar7 = pCenter.y - (ref->p).y;
    wcX.y._0_4_ = SUB84(dVar7,0);
    wcX.x = pCenter.x - (ref->p).x;
    wcX.y._4_4_ = (int)((ulong)dVar7 >> 0x20);
    normalize<double>(&wc,&wcX);
    wcX._0_16_ = ZEXT816(0);
    wcX.z = 0.0;
    wcY.x = 0.0;
    wcY.y = 0.0;
    wcY.z = 0.0;
    coordinateSystem<double>(&wc,&wcX,&wcY);
    dVar7 = this->radius;
    dVar4 = distanceSquared<double>(&ref->p,&pCenter);
    dVar7 = 1.0 - (dVar7 * dVar7) / dVar4;
    if (dVar7 <= 0.0) {
      dVar7 = 0.0;
    }
    dVar4 = u->y;
    dVar8 = u->x * SQRT(dVar7) + (1.0 - u->x);
    dVar6 = 1.0 - dVar8 * dVar8;
    if (dVar6 <= 0.0) {
      dVar6 = 0.0;
    }
    dVar5 = distance<double>(&ref->p,&pCenter);
    dVar1 = this->radius;
    dVar6 = dVar1 * dVar1 - dVar5 * dVar5 * SQRT(dVar6) * SQRT(dVar6);
    if (dVar6 <= 0.0) {
      dVar6 = 0.0;
    }
    dVar6 = dVar8 * dVar5 - SQRT(dVar6);
    dVar8 = ((dVar5 * dVar5 + dVar1 * dVar1) - dVar6 * dVar6) / ((dVar5 + dVar5) * dVar1);
    dVar6 = 1.0 - dVar8 * dVar8;
    if (dVar6 <= 0.0) {
      dVar6 = 0.0;
    }
    local_88.z = -wcX.z;
    local_88.x._4_4_ = wcX.x._4_4_ ^ 0x80000000;
    local_88.y._4_4_ = wcX.y._4_4_ ^ 0x80000000;
    local_88.x._0_4_ = wcX.x._0_4_;
    local_88.y._0_4_ = wcX.y._0_4_;
    local_a8.z = -wcY.z;
    local_a8.x._4_4_ = wcY.x._4_4_ ^ 0x80000000;
    local_a8.y._4_4_ = wcY.y._4_4_ ^ 0x80000000;
    local_a8.x._0_4_ = wcY.x._0_4_;
    local_a8.y._0_4_ = wcY.y._0_4_;
    local_c8.x._4_4_ = wc.x._4_4_ ^ 0x80000000;
    local_c8.y._4_4_ = wc.y._4_4_ ^ 0x80000000;
    local_c8.x._0_4_ = wc.x._0_4_;
    local_c8.y._0_4_ = wc.y._0_4_;
    local_c8.z = -wc.z;
    sphericalDirection(&nWorld,SQRT(dVar6),dVar8,(dVar4 + dVar4) * 3.141592653589793,&local_88,
                       &local_a8,&local_c8);
    dVar4 = this->radius;
    dVar8 = dVar4 * nWorld.z + pCenter.z;
    (__return_storage_ptr__->wo).z = 0.0;
    dVar6 = dVar4 * nWorld.x + pCenter.x;
    dVar4 = dVar4 * nWorld.y + pCenter.y;
    (__return_storage_ptr__->wo).x = 0.0;
    (__return_storage_ptr__->wo).y = 0.0;
    auVar2._8_4_ = SUB84(dVar4,0);
    auVar2._0_8_ = dVar6;
    auVar2._12_4_ = (int)((ulong)dVar4 >> 0x20);
    (__return_storage_ptr__->p).x = dVar6;
    (__return_storage_ptr__->p).y = (double)auVar2._8_8_;
    (__return_storage_ptr__->p).z = dVar8;
    auVar3._8_4_ = SUB84(ABS(dVar4) * 5.551115123125786e-16,0);
    auVar3._0_8_ = ABS(dVar6) * 5.551115123125786e-16;
    auVar3._12_4_ = (int)((ulong)(ABS(dVar4) * 5.551115123125786e-16) >> 0x20);
    (__return_storage_ptr__->pfError).x = ABS(dVar6) * 5.551115123125786e-16;
    (__return_storage_ptr__->pfError).y = (double)auVar3._8_8_;
    (__return_storage_ptr__->pfError).z = ABS(dVar8) * 5.551115123125786e-16;
    (__return_storage_ptr__->n).x = nWorld.x;
    (__return_storage_ptr__->n).y = nWorld.y;
    (__return_storage_ptr__->n).z = nWorld.z;
    if ((this->super_Shape).reverseNormals == true) {
      Normal3<double>::operator*=(&__return_storage_ptr__->n,-1);
    }
    *pdf = 1.0 / ((1.0 - SQRT(dVar7)) * 6.283185307179586);
  }
  return __return_storage_ptr__;
}

Assistant:

Interaction Sphere::sample(const Interaction& ref, const Point2f& u,
                           Real* pdf) const {
    Point3f pCenter = (*localToWorld)(Point3f(0, 0, 0));

    // Sample uniformly on sphere if $\pt{}$ is inside it
    Point3f pOrigin = offsetRayOrigin(ref.p, ref.n, pCenter - ref.p, ref.pfError);

    if (distanceSquared(pOrigin, pCenter) <= radius * radius) {
        Interaction intr = sample(u, pdf);
        Vector3f wi = intr.p - ref.p;
        if (wi.lengthSquared() == 0) {
            *pdf = 0;
        } else {
            // Convert from area measure returned by Sample() call above to
            // solid angle measure.
            wi = normalize(wi);
            *pdf *= distanceSquared(ref.p, intr.p) / absDot(intr.n, -wi);
        }

        if (std::isinf(*pdf)) *pdf = 0.f;
        return intr;
    }

    // Compute coordinate system for sphere sampling
    Vector3f wc = normalize(pCenter - ref.p);
    Vector3f wcX, wcY;
    coordinateSystem(wc, &wcX, &wcY);

    // Sample sphere uniformly inside subtended cone

    // Compute $\theta$ and $\phi$ values for sample in cone
    Real sinThetaMax2 = radius * radius / distanceSquared(ref.p, pCenter);
    Real cosThetaMax = std::sqrt(std::max((Real)0, 1 - sinThetaMax2));
    Real cosTheta = (1 - u[0]) + u[0] * cosThetaMax;
    Real sinTheta = std::sqrt(std::max((Real)0, 1 - cosTheta * cosTheta));
    Real phi = u[1] * 2 * Pi;

    // Compute angle $\alpha$ from center of sphere to sampled point on surface
    Real dc = distance(ref.p, pCenter);
    Real ds = dc * cosTheta -
               std::sqrt(std::max(
                   (Real)0, radius * radius - dc * dc * sinTheta * sinTheta));
    Real cosAlpha = (dc * dc + radius * radius - ds * ds) / (2 * dc * radius);
    Real sinAlpha = std::sqrt(std::max((Real)0, 1 - cosAlpha * cosAlpha));

    // Compute surface normal and sampled point on sphere
    Vector3f nWorld = sphericalDirection(sinAlpha, cosAlpha, phi, -wcX, -wcY, -wc);
    Point3f pWorld = pCenter + radius * Point3f(nWorld.x, nWorld.y, nWorld.z);

    // Return _Interaction_ for sampled point on sphere
    Interaction it; it.p = pWorld;
    it.pfError = gamma(5) * abs((Vector3f)pWorld);
    it.n = Normal3f(nWorld);
    if (reverseNormals) it.n *= -1;

    // Uniform cone PDF.
    *pdf = 1 / (2 * Pi * (1 - cosThetaMax));

    return it;
}